

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_case.cpp
# Opt level: O0

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformCase(Transformer *this,PGCaseExpr *root)

{
  bool bVar1;
  optional_ptr<duckdb_libpgquery::PGCaseWhen,_true> args;
  PGCaseWhen *args_1;
  optional_ptr<duckdb_libpgquery::PGNode,_true> oVar2;
  pointer pPVar3;
  pointer pCVar4;
  type this_00;
  long in_RDX;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> in_RDI;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> test;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> test_raw
  ;
  optional_ptr<duckdb_libpgquery::PGCaseWhen,_true> w;
  CaseCheck case_check;
  PGListCell *cell;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> root_arg
  ;
  templated_unique_single_t case_node;
  value_type *in_stack_fffffffffffffe58;
  Value *in_stack_fffffffffffffe60;
  LogicalType *in_stack_fffffffffffffe68;
  int query_location;
  Transformer *in_stack_fffffffffffffe70;
  optional_ptr<duckdb_libpgquery::PGNode,_true> in_stack_fffffffffffffe78;
  LogicalType *in_stack_fffffffffffffe80;
  LogicalType local_a0 [2];
  PGNode *local_70;
  PGCaseWhen *local_60;
  long local_48;
  PGNode *local_30;
  long local_18;
  
  local_18 = in_RDX;
  make_uniq<duckdb::CaseExpression>();
  local_30 = (PGNode *)PGPointerCast<duckdb_libpgquery::PGNode>(in_stack_fffffffffffffe58);
  TransformExpression(in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
  for (local_48 = *(long *)(*(long *)(local_18 + 0x18) + 8); local_48 != 0;
      local_48 = *(long *)(local_48 + 8)) {
    CaseCheck::CaseCheck((CaseCheck *)in_stack_fffffffffffffe60);
    args = PGPointerCast<duckdb_libpgquery::PGCaseWhen>(in_stack_fffffffffffffe58);
    local_60 = args.ptr;
    args_1 = optional_ptr<duckdb_libpgquery::PGCaseWhen,_true>::operator->
                       ((optional_ptr<duckdb_libpgquery::PGCaseWhen,_true> *)
                        in_stack_fffffffffffffe60);
    oVar2 = PGPointerCast<duckdb_libpgquery::PGNode>(in_stack_fffffffffffffe58);
    local_70 = (PGNode *)oVar2;
    TransformExpression(in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)0x1a0ec34);
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        *)0x1a0ec41);
    if (bVar1) {
      local_a0[0].type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
           = 0x19;
      pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)in_stack_fffffffffffffe60);
      (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_a0[0].type_info_);
      make_uniq<duckdb::ComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((ExpressionType *)args.ptr,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)args_1,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)oVar2.ptr);
      unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
      unique_ptr<duckdb::ComparisonExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
                ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffe60,
                 (unique_ptr<duckdb::ComparisonExpression,_std::default_delete<duckdb::ComparisonExpression>_>
                  *)in_stack_fffffffffffffe58);
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->when_expr);
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)0x1a0ecdc);
      unique_ptr<duckdb::ComparisonExpression,_std::default_delete<duckdb::ComparisonExpression>,_true>
      ::~unique_ptr((unique_ptr<duckdb::ComparisonExpression,_std::default_delete<duckdb::ComparisonExpression>,_true>
                     *)0x1a0ece9);
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)0x1a0ecf6);
    }
    else {
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->when_expr);
    }
    optional_ptr<duckdb_libpgquery::PGCaseWhen,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGCaseWhen,_true> *)in_stack_fffffffffffffe60);
    PGPointerCast<duckdb_libpgquery::PGNode>(in_stack_fffffffffffffe58);
    TransformExpression(in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe80 = local_a0;
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->when_expr);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x1a0edf7);
    unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::
    operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                *)in_stack_fffffffffffffe60);
    ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::push_back
              ((vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_> *)
               in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x1a0ee30);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x1a0ee3d);
    CaseCheck::~CaseCheck((CaseCheck *)in_stack_fffffffffffffe60);
  }
  if (*(long *)(local_18 + 0x20) == 0) {
    LogicalType::LogicalType
              (in_stack_fffffffffffffe80,
               (LogicalTypeId)((ulong)in_stack_fffffffffffffe78.ptr >> 0x38));
    Value::Value((Value *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    make_uniq<duckdb::ConstantExpression,duckdb::Value>((Value *)in_RDI._M_head_impl);
    unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
    unique_ptr<duckdb::ConstantExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffffe60,
               (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>_>
                *)in_stack_fffffffffffffe58);
    pCVar4 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::
             operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                         *)in_stack_fffffffffffffe60);
    query_location = (int)((ulong)pCVar4 >> 0x20);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->when_expr);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x1a0efec);
    unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                 *)0x1a0eff9);
    Value::~Value(in_stack_fffffffffffffe60);
    LogicalType::~LogicalType((LogicalType *)0x1a0f013);
  }
  else {
    oVar2 = PGPointerCast<duckdb_libpgquery::PGNode>(in_stack_fffffffffffffe58);
    query_location = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    TransformExpression(in_stack_fffffffffffffe70,oVar2);
    in_stack_fffffffffffffe70 =
         (Transformer *)
         unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::
         operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                     *)in_stack_fffffffffffffe60);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->when_expr);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x1a0ef1a);
  }
  this_00 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::
            operator*((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                       *)in_stack_fffffffffffffe60);
  SetQueryLocation((ParsedExpression *)in_stack_fffffffffffffe70,query_location);
  unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
  unique_ptr<duckdb::CaseExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
            ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)this_00,
             (unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>_> *)
             in_stack_fffffffffffffe58);
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)0x1a0f0d5);
  unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
              *)0x1a0f0e2);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )in_RDI._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformCase(duckdb_libpgquery::PGCaseExpr &root) {
	auto case_node = make_uniq<CaseExpression>();
	auto root_arg = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(root.arg));
	for (auto cell = root.args->head; cell != nullptr; cell = cell->next) {
		CaseCheck case_check;

		auto w = PGPointerCast<duckdb_libpgquery::PGCaseWhen>(cell->data.ptr_value);
		auto test_raw = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(w->expr));
		unique_ptr<ParsedExpression> test;
		if (root_arg) {
			case_check.when_expr =
			    make_uniq<ComparisonExpression>(ExpressionType::COMPARE_EQUAL, root_arg->Copy(), std::move(test_raw));
		} else {
			case_check.when_expr = std::move(test_raw);
		}
		case_check.then_expr = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(w->result));
		case_node->case_checks.push_back(std::move(case_check));
	}

	if (root.defresult) {
		case_node->else_expr = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(root.defresult));
	} else {
		case_node->else_expr = make_uniq<ConstantExpression>(Value(LogicalType::SQLNULL));
	}
	SetQueryLocation(*case_node, root.location);
	return std::move(case_node);
}